

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

bool Diligent::TextureComponentMappingFromString
               (String *MappingStr,TextureComponentMapping *Mapping)

{
  char cVar1;
  TextureComponentMapping TVar2;
  ulong uVar3;
  char *pcVar4;
  TEXTURE_COMPONENT_SWIZZLE *pTVar5;
  TEXTURE_COMPONENT_SWIZZLE local_42;
  TEXTURE_COMPONENT_SWIZZLE local_3f;
  TEXTURE_COMPONENT_SWIZZLE local_3c;
  TEXTURE_COMPONENT_SWIZZLE local_39;
  ulong uStack_28;
  char Chr;
  size_t Comp;
  bool AllOK;
  TextureComponentMapping *Mapping_local;
  String *MappingStr_local;
  
  TVar2 = TextureComponentMapping::Identity();
  *Mapping = TVar2;
  uVar3 = std::__cxx11::string::length();
  Comp._3_1_ = uVar3 < 5;
  for (uStack_28 = 0; uVar3 = std::__cxx11::string::length(), uStack_28 < uVar3;
      uStack_28 = uStack_28 + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)MappingStr);
    cVar1 = *pcVar4;
    if ((cVar1 == 'r') || (cVar1 == 'R')) {
      local_39 = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
      if (uStack_28 != 0) {
        local_39 = TEXTURE_COMPONENT_SWIZZLE_R;
      }
      pTVar5 = TextureComponentMapping::operator[](Mapping,uStack_28);
      *pTVar5 = local_39;
    }
    else if ((cVar1 == 'g') || (cVar1 == 'G')) {
      local_3c = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
      if (uStack_28 != 1) {
        local_3c = TEXTURE_COMPONENT_SWIZZLE_G;
      }
      pTVar5 = TextureComponentMapping::operator[](Mapping,uStack_28);
      *pTVar5 = local_3c;
    }
    else if ((cVar1 == 'b') || (cVar1 == 'B')) {
      local_3f = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
      if (uStack_28 != 2) {
        local_3f = TEXTURE_COMPONENT_SWIZZLE_B;
      }
      pTVar5 = TextureComponentMapping::operator[](Mapping,uStack_28);
      *pTVar5 = local_3f;
    }
    else if ((cVar1 == 'a') || (cVar1 == 'A')) {
      local_42 = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
      if (uStack_28 != 3) {
        local_42 = TEXTURE_COMPONENT_SWIZZLE_A;
      }
      pTVar5 = TextureComponentMapping::operator[](Mapping,uStack_28);
      *pTVar5 = local_42;
    }
    else if (cVar1 == '0') {
      pTVar5 = TextureComponentMapping::operator[](Mapping,uStack_28);
      *pTVar5 = TEXTURE_COMPONENT_SWIZZLE_ZERO;
    }
    else if (cVar1 == '1') {
      pTVar5 = TextureComponentMapping::operator[](Mapping,uStack_28);
      *pTVar5 = TEXTURE_COMPONENT_SWIZZLE_ONE;
    }
    else {
      Comp._3_1_ = false;
    }
  }
  return Comp._3_1_;
}

Assistant:

bool TextureComponentMappingFromString(const String& MappingStr, TextureComponentMapping& Mapping)
{
    Mapping = TextureComponentMapping::Identity();

    bool AllOK = MappingStr.length() <= 4;

    for (size_t Comp = 0; Comp < MappingStr.length(); ++Comp)
    {
        const char Chr = MappingStr[Comp];
        if (Chr == 'r' || Chr == 'R')
            Mapping[Comp] = Comp == 0 ? TEXTURE_COMPONENT_SWIZZLE_IDENTITY : TEXTURE_COMPONENT_SWIZZLE_R;
        else if (Chr == 'g' || Chr == 'G')
            Mapping[Comp] = Comp == 1 ? TEXTURE_COMPONENT_SWIZZLE_IDENTITY : TEXTURE_COMPONENT_SWIZZLE_G;
        else if (Chr == 'b' || Chr == 'B')
            Mapping[Comp] = Comp == 2 ? TEXTURE_COMPONENT_SWIZZLE_IDENTITY : TEXTURE_COMPONENT_SWIZZLE_B;
        else if (Chr == 'a' || Chr == 'A')
            Mapping[Comp] = Comp == 3 ? TEXTURE_COMPONENT_SWIZZLE_IDENTITY : TEXTURE_COMPONENT_SWIZZLE_A;
        else if (Chr == '0')
            Mapping[Comp] = TEXTURE_COMPONENT_SWIZZLE_ZERO;
        else if (Chr == '1')
            Mapping[Comp] = TEXTURE_COMPONENT_SWIZZLE_ONE;
        else
            AllOK = false;
    }
    return AllOK;
}